

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::createMutableCubeArrayColor
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  CubeMapArrayDataStorage *pCVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pCVar1 = this->m_cube_map_array_data;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1320))
            (0x9009,0,0x8058,pCVar1[test_index].m_width,pCVar1[test_index].m_height,
             pCVar1[test_index].m_depth,0,0x1908,0x1401,pCVar1[test_index].m_data_array);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"Could not create a mutable color texture storage!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x23a);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::createMutableCubeArrayColor(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY,						 /* target */
				  0,												 /* level */
				  GL_RGBA8,											 /* internal format */
				  m_cube_map_array_data[test_index].getWidth(),		 /* width */
				  m_cube_map_array_data[test_index].getHeight(),	 /* height */
				  m_cube_map_array_data[test_index].getDepth(),		 /* depth */
				  0,												 /* border */
				  GL_RGBA,											 /* format */
				  GL_UNSIGNED_BYTE,									 /* type */
				  m_cube_map_array_data[test_index].getDataArray()); /* pixel data */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a mutable color texture storage!");
}